

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.h
# Opt level: O0

char * __thiscall
btGeneric6DofConstraint::serialize
          (btGeneric6DofConstraint *this,void *dataBuffer,btSerializer *serializer)

{
  btScalar *pbVar1;
  btSerializer *in_RSI;
  btTransform *in_RDI;
  btTypedConstraint *unaff_retaddr;
  int i;
  btGeneric6DofConstraintData *dof;
  btTransformFloatData *in_stack_ffffffffffffffc8;
  int local_24;
  
  btTypedConstraint::serialize(unaff_retaddr,in_RDI,in_RSI);
  btTransform::serialize(in_RDI,in_stack_ffffffffffffffc8);
  btTransform::serialize(in_RDI,in_stack_ffffffffffffffc8);
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    *(btScalar *)(in_RSI + (long)local_24 * 4 + 0xf0) =
         in_RDI[(long)local_24 + 0xd].m_origin.m_floats[3];
    *(btScalar *)(in_RSI + (long)local_24 * 4 + 0xe0) =
         in_RDI[(long)local_24 + 0xe].m_basis.m_el[0].m_floats[0];
    pbVar1 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xb));
    *(btScalar *)(in_RSI + (long)local_24 * 4 + 0xd0) = pbVar1[local_24];
    pbVar1 = btVector3::operator_cast_to_float_(in_RDI[0xb].m_basis.m_el + 1);
    *(btScalar *)(in_RSI + (long)local_24 * 4 + 0xc0) = pbVar1[local_24];
  }
  *(uint *)(in_RSI + 0x100) = (uint)(((uint)in_RDI[0x14].m_basis.m_el[2].m_floats[3] & 1) != 0);
  *(uint *)(in_RSI + 0x104) =
       (uint)((*(byte *)((long)in_RDI[0x14].m_basis.m_el[2].m_floats + 0xd) & 1) != 0);
  return "btGeneric6DofConstraintData";
}

Assistant:

SIMD_FORCE_INLINE	const char*	btGeneric6DofConstraint::serialize(void* dataBuffer, btSerializer* serializer) const
{

	btGeneric6DofConstraintData2* dof = (btGeneric6DofConstraintData2*)dataBuffer;
	btTypedConstraint::serialize(&dof->m_typeConstraintData,serializer);

	m_frameInA.serialize(dof->m_rbAFrame);
	m_frameInB.serialize(dof->m_rbBFrame);

		
	int i;
	for (i=0;i<3;i++)
	{
		dof->m_angularLowerLimit.m_floats[i] =  m_angularLimits[i].m_loLimit;
		dof->m_angularUpperLimit.m_floats[i] =  m_angularLimits[i].m_hiLimit;
		dof->m_linearLowerLimit.m_floats[i] = m_linearLimits.m_lowerLimit[i];
		dof->m_linearUpperLimit.m_floats[i] = m_linearLimits.m_upperLimit[i];
	}
	
	dof->m_useLinearReferenceFrameA = m_useLinearReferenceFrameA? 1 : 0;
	dof->m_useOffsetForConstraintFrame = m_useOffsetForConstraintFrame ? 1 : 0;

	return btGeneric6DofConstraintDataName;
}